

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStairFlightType::IfcStairFlightType(IfcStairFlightType *this)

{
  IfcStairFlightType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcStairFlightType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00f52ac0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>,
             &PTR_construction_vtable_24__00f52bf8);
  *(undefined8 *)this = 0xf52990;
  *(undefined8 *)&this->field_0x1c0 = 0xf52aa8;
  *(undefined8 *)&this->field_0x88 = 0xf529b8;
  *(undefined8 *)&this->field_0x98 = 0xf529e0;
  *(undefined8 *)&this->field_0xf0 = 0xf52a08;
  *(undefined8 *)&this->field_0x148 = 0xf52a30;
  *(undefined8 *)&this->field_0x180 = 0xf52a58;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf52a80;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>).
              field_0x10);
  return;
}

Assistant:

IfcStairFlightType() : Object("IfcStairFlightType") {}